

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  N_Vector v;
  N_Vector v_00;
  SUNMatrix A;
  long lVar9;
  undefined8 *puVar10;
  realtype *prVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  char *__s;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  SUNMatrix local_60;
  
  if (argc < 4) {
    __s = "ERROR: THREE (3) Input required: matrix rows, matrix cols, print timing ";
  }
  else {
    lVar7 = atol(argv[1]);
    if (lVar7 < 1) {
      __s = "ERROR: number of rows must be a positive integer ";
    }
    else {
      lVar8 = atol(argv[2]);
      if (0 < lVar8) {
        iVar3 = atoi(argv[3]);
        SetTiming(iVar3);
        local_60 = (SUNMatrix)0x0;
        printf("\nDense matrix test: size %ld by %ld\n\n",lVar7,lVar8);
        v = (N_Vector)N_VNew_Serial(lVar8);
        v_00 = (N_Vector)N_VNew_Serial(lVar7);
        A = (SUNMatrix)SUNDenseMatrix(lVar7,lVar8);
        if (lVar7 == lVar8) {
          local_60 = (SUNMatrix)SUNDenseMatrix(lVar7,lVar7);
        }
        lVar9 = SUNDenseMatrix_Data(A);
        auVar29 = _DAT_00104020;
        auVar2 = _DAT_00104010;
        uVar22 = lVar7 + 1U & 0xfffffffffffffffe;
        lVar12 = lVar7 + -1;
        auVar30._8_4_ = (int)lVar12;
        auVar30._0_8_ = lVar12;
        auVar30._12_4_ = (int)((ulong)lVar12 >> 0x20);
        lVar9 = lVar9 + 8;
        lVar12 = 3;
        lVar14 = 1;
        lVar15 = 2;
        lVar16 = 0;
        auVar30 = auVar30 ^ _DAT_00104020;
        lVar17 = 0;
        do {
          lVar17 = lVar17 + 1;
          uVar20 = 0;
          lVar18 = lVar16;
          lVar19 = lVar14;
          auVar26 = auVar2;
          do {
            iVar4 = auVar30._0_4_;
            bVar1 = iVar4 < SUB164(auVar26 ^ auVar29,0);
            iVar3 = SUB164(auVar26 ^ auVar29,4);
            iVar5 = auVar30._4_4_;
            iVar6 = auVar30._12_4_;
            if ((bool)(~(iVar5 < iVar3 || iVar3 == iVar5 && bVar1) & 1)) {
              *(double *)(lVar9 + -8 + uVar20 * 8) = (double)lVar18;
            }
            if (iVar5 >= iVar3 && (iVar3 != iVar5 || !bVar1)) {
              *(double *)(lVar9 + uVar20 * 8) = (double)lVar19;
            }
            uVar20 = uVar20 + 2;
            lVar28 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 2;
            auVar26._8_8_ = lVar28 + 2;
            lVar19 = lVar19 + lVar15;
            lVar18 = lVar18 + lVar15;
          } while (uVar22 != uVar20);
          lVar14 = lVar14 + lVar12;
          lVar12 = lVar12 + 2;
          lVar9 = lVar9 + lVar7 * 8;
          lVar16 = lVar16 + lVar15;
          lVar15 = lVar15 + 2;
        } while (lVar17 != lVar8);
        if (lVar7 == lVar8) {
          puVar10 = (undefined8 *)SUNDenseMatrix_Data(local_60);
          auVar29 = _DAT_00104030;
          auVar2 = _DAT_00104020;
          uVar20 = 0;
          auVar23 = _DAT_00104010;
          do {
            auVar26 = auVar23 ^ auVar2;
            if ((bool)(~(auVar26._4_4_ == iVar5 && iVar4 < auVar26._0_4_ || iVar5 < auVar26._4_4_) &
                      1)) {
              *puVar10 = 0x3ff0000000000000;
            }
            if ((auVar26._12_4_ != iVar6 || auVar26._8_4_ <= auVar30._8_4_) &&
                auVar26._12_4_ <= iVar6) {
              puVar10[lVar7 + 1] = 0x3ff0000000000000;
            }
            uVar20 = uVar20 + 2;
            lVar12 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + auVar29._0_8_;
            auVar23._8_8_ = lVar12 + auVar29._8_8_;
            puVar10 = puVar10 + lVar7 * 2 + 2;
          } while (uVar22 != uVar20);
        }
        prVar11 = N_VGetArrayPointer(v);
        auVar2 = _DAT_00104020;
        uVar20 = lVar8 + 1;
        lVar12 = lVar8 + -1;
        auVar24._8_4_ = (int)lVar12;
        auVar24._0_8_ = lVar12;
        auVar24._12_4_ = (int)((ulong)lVar12 >> 0x20);
        uVar13 = 0;
        auVar24 = auVar24 ^ _DAT_00104020;
        auVar27._8_4_ = 0xffffffff;
        auVar27._0_8_ = 0xffffffffffffffff;
        auVar27._12_4_ = 0xffffffff;
        auVar29 = _DAT_00104010;
        do {
          auVar26 = auVar29 ^ auVar2;
          lVar12 = auVar29._8_8_;
          if ((bool)(~(auVar26._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar26._0_4_ ||
                      auVar24._4_4_ < auVar26._4_4_) & 1)) {
            prVar11[uVar13] = 1.0 / (double)(auVar29._0_8_ + 1);
          }
          if ((auVar26._12_4_ != auVar24._12_4_ || auVar26._8_4_ <= auVar24._8_4_) &&
              auVar26._12_4_ <= auVar24._12_4_) {
            prVar11[uVar13 + 1] = 1.0 / (double)(lVar12 - auVar27._8_8_);
          }
          uVar13 = uVar13 + 2;
          auVar29._0_8_ = auVar29._0_8_ + 2;
          auVar29._8_8_ = lVar12 + 2;
        } while ((uVar20 & 0xfffffffffffffffe) != uVar13);
        prVar11 = N_VGetArrayPointer(v_00);
        auVar2 = _DAT_00104020;
        uVar13 = 0;
        auVar25 = _DAT_00104010;
        do {
          auVar29 = auVar25 ^ auVar2;
          if ((bool)(~(auVar29._4_4_ == iVar5 && iVar4 < auVar29._0_4_ || iVar5 < auVar29._4_4_) & 1
                    )) {
            prVar11[uVar13] = (double)(long)(uVar20 - 2) * (double)lVar8 * 0.5;
          }
          if ((auVar29._12_4_ != iVar6 || auVar29._8_4_ <= auVar30._8_4_) && auVar29._12_4_ <= iVar6
             ) {
            prVar11[uVar13 + 1] = (double)(long)uVar20 * (double)lVar8 * 0.5;
          }
          uVar13 = uVar13 + 2;
          lVar12 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 2;
          auVar25._8_8_ = lVar12 + 2;
          uVar20 = uVar20 + 4;
        } while (uVar22 != uVar13);
        iVar3 = Test_SUNMatGetID(A,SUNMATRIX_DENSE,0);
        iVar4 = Test_SUNMatClone(A,0);
        iVar5 = Test_SUNMatCopy(A,0);
        iVar6 = Test_SUNMatZero(A,0);
        iVar3 = iVar6 + iVar5 + iVar4 + iVar3;
        if (lVar7 == lVar8) {
          iVar4 = Test_SUNMatScaleAdd(A,local_60,0);
          iVar5 = Test_SUNMatScaleAddI(A,local_60,0);
          iVar3 = iVar3 + iVar5 + iVar4;
        }
        iVar4 = Test_SUNMatMatvec(A,v,v_00,0);
        iVar5 = Test_SUNMatSpace(A,0);
        uVar21 = iVar5 + iVar4 + iVar3;
        if (uVar21 == 0) {
          puts("SUCCESS: SUNMatrix module passed all tests \n ");
        }
        else {
          printf("FAIL: SUNMatrix module failed %i tests \n \n",(ulong)uVar21);
          puts("\nA =");
          SUNDenseMatrix_Print(A,_stdout);
          if (lVar7 == lVar8) {
            puts("\nI =");
            SUNDenseMatrix_Print(local_60,_stdout);
          }
          puts("\nx =");
          N_VPrint_Serial(v);
          puts("\ny =");
          N_VPrint_Serial(v_00);
        }
        N_VDestroy_Serial(v);
        N_VDestroy_Serial(v_00);
        SUNMatDestroy(A);
        if (lVar7 != lVar8) {
          return uVar21;
        }
        SUNMatDestroy(local_60);
        return uVar21;
      }
      __s = "ERROR: number of cols must be a positive integer ";
    }
  }
  puts(__s);
  return -1;
}

Assistant:

int main(int argc, char *argv[]) 
{
  int          fails = 0;        /* counter for test failures  */
  sunindextype matrows, matcols; /* vector length              */
  N_Vector     x, y;             /* test vectors               */
  realtype     *xdata, *ydata;   /* pointers to vector data    */
  SUNMatrix    A, I;             /* test matrices              */
  realtype     *Adata, *Idata;   /* pointers to matrix data    */
  int          print_timing, square;
  sunindextype i, j, m, n;

  /* check input and set vector length */
  if (argc < 4){
    printf("ERROR: THREE (3) Input required: matrix rows, matrix cols, print timing \n");
    return(-1);
  }
  
  matrows = atol(argv[1]); 
  if (matrows <= 0) {
    printf("ERROR: number of rows must be a positive integer \n");
    return(-1); 
  }
  
  matcols = atol(argv[2]); 
  if (matcols <= 0) {
    printf("ERROR: number of cols must be a positive integer \n");
    return(-1); 
  }

  print_timing = atoi(argv[3]);
  SetTiming(print_timing);
  
  square = (matrows == matcols) ? 1 : 0;
  printf("\nDense matrix test: size %ld by %ld\n\n",
         (long int) matrows, (long int) matcols);

  /* Initialize vectors and matrices to NULL */
  x = NULL;
  y = NULL;
  A = NULL;
  I = NULL;
  
  /* Create vectors and matrices */
  x = N_VNew_Serial(matcols);
  y = N_VNew_Serial(matrows);
  A = SUNDenseMatrix(matrows, matcols);
  I = NULL;
  if (square)
    I = SUNDenseMatrix(matrows, matcols);
  
  /* Fill matrices and vectors */
  Adata = SUNDenseMatrix_Data(A);
  for(j=0; j < matcols; j++) {
    for(i=0; i < matrows; i++) {
      Adata[j*matrows + i] = (j+1)*(i+j);
    }
  }

  if (square) {
    Idata = SUNDenseMatrix_Data(I);
    for(i=0, j=0; i < matrows; i++, j++) {
      Idata[j*matrows + i] = ONE;
    }
  }

  xdata = N_VGetArrayPointer(x);
  for(i=0; i < matcols; i++) {
    xdata[i] = ONE / (i+1);
  }

  ydata = N_VGetArrayPointer(y);
  for(i=0; i < matrows; i++) {
    m = i;
    n = m + matcols - 1;
    ydata[i] = HALF*(n+1-m)*(n+m);
  }
    
  /* SUNMatrix Tests */
  fails += Test_SUNMatGetID(A, SUNMATRIX_DENSE, 0);
  fails += Test_SUNMatClone(A, 0);
  fails += Test_SUNMatCopy(A, 0);
  fails += Test_SUNMatZero(A, 0);
  if (square) {
    fails += Test_SUNMatScaleAdd(A, I, 0);
    fails += Test_SUNMatScaleAddI(A, I, 0);
  }
  fails += Test_SUNMatMatvec(A, x, y, 0);
  fails += Test_SUNMatSpace(A, 0);

  /* Print result */
  if (fails) {
    printf("FAIL: SUNMatrix module failed %i tests \n \n", fails);
    printf("\nA =\n");
    SUNDenseMatrix_Print(A,stdout);
    if (square) {
      printf("\nI =\n");
      SUNDenseMatrix_Print(I,stdout);
    }
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
  } else {
    printf("SUCCESS: SUNMatrix module passed all tests \n \n");
  }

  /* Free vectors and matrices */
  N_VDestroy_Serial(x);
  N_VDestroy_Serial(y);
  SUNMatDestroy(A);
  if (square)
    SUNMatDestroy(I);

  return(fails);
}